

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  tm *ptVar1;
  bool local_4e;
  int local_4c;
  long lStack_48;
  int i;
  time_t Julian;
  time_t Seconds_local;
  time_t Minutes_local;
  time_t Hours_local;
  time_t Year_local;
  time_t Day_local;
  time_t Month_local;
  
  if (Year < 0x45) {
    Hours_local = Year + 2000;
  }
  else {
    Hours_local = Year;
    if (Year < 100) {
      Hours_local = Year + 0x76c;
    }
  }
  local_4e = false;
  if (Hours_local % 4 == 0) {
    local_4e = Hours_local % 100 != 0 || Hours_local % 400 == 0;
  }
  Convert::DaysInMonth[1] = 0x1c;
  if (local_4e) {
    Convert::DaysInMonth[1] = 0x1d;
  }
  if (((((Hours_local < 0x7b2) || (0x7f6 < Hours_local)) || (Month < 1)) ||
      ((((0xc < Month || (Day < 1)) ||
        ((Day_local = Month + -1, Convert::DaysInMonth[(int)Day_local] < Day ||
         ((Hours < 0 || (0x17 < Hours)))))) || (Minutes < 0)))) ||
     (((0x3b < Minutes || (Seconds < 0)) || (0x3b < Seconds)))) {
    Month_local = -1;
  }
  else {
    lStack_48 = Day + -1;
    for (local_4c = 0; local_4c < Day_local; local_4c = local_4c + 1) {
      lStack_48 = Convert::DaysInMonth[local_4c] + lStack_48;
    }
    for (local_4c = 0x7b2; local_4c < Hours_local; local_4c = local_4c + 1) {
      lStack_48 = (int)((local_4c % 4 == 0) + 0x16d) + lStack_48;
    }
    lStack_48 = Hours * 0xe10 + Minutes * 0x3c + Seconds + Timezone + lStack_48 * 0x15180;
    if ((DSTmode == DSTon) ||
       ((DSTmode == DSTmaybe &&
        (Julian = Seconds, Seconds_local = Minutes, Minutes_local = Hours, Year_local = Day,
        ptVar1 = localtime(&stack0xffffffffffffffb8), ptVar1->tm_isdst != 0)))) {
      lStack_48 = lStack_48 + -0xe10;
    }
    Month_local = lStack_48;
  }
  return Month_local;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	static int DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t	Julian;
	int	i;

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year > 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && localtime(&Julian)->tm_isdst))
		Julian -= HOUR;
	return Julian;
}